

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O2

Regexp * duckdb_re2::Regexp::RemoveLeadingRegexp(Regexp *re)

{
  Regexp **__dest;
  Regexp *pRVar1;
  ushort uVar2;
  
  if (re->op_ != '\x02') {
    if ((re->op_ == '\x05') && (1 < re->nsub_)) {
      __dest = (re->field_5).submany_;
      if ((*__dest)->op_ != '\x02') {
        Decref(*__dest);
        *__dest = (Regexp *)0x0;
        if (re->nsub_ == 2) {
          pRVar1 = __dest[1];
          __dest[1] = (Regexp *)0x0;
          Decref(re);
          re = pRVar1;
        }
        else {
          uVar2 = re->nsub_ - 1;
          re->nsub_ = uVar2;
          memmove(__dest,__dest + 1,(ulong)uVar2 << 3);
        }
      }
    }
    else {
      uVar2 = re->parse_flags_;
      Decref(re);
      re = (Regexp *)operator_new(0x28);
      Regexp(re,kRegexpEmptyMatch,(uint)uVar2);
    }
  }
  return re;
}

Assistant:

Regexp* Regexp::RemoveLeadingRegexp(Regexp* re) {
  if (re->op() == kRegexpEmptyMatch)
    return re;
  if (re->op() == kRegexpConcat && re->nsub() >= 2) {
    Regexp** sub = re->sub();
    if (sub[0]->op() == kRegexpEmptyMatch)
      return re;
    sub[0]->Decref();
    sub[0] = NULL;
    if (re->nsub() == 2) {
      // Collapse concatenation to single regexp.
      Regexp* nre = sub[1];
      sub[1] = NULL;
      re->Decref();
      return nre;
    }
    // 3 or more -> 2 or more.
    re->nsub_--;
    memmove(sub, sub + 1, re->nsub_ * sizeof sub[0]);
    return re;
  }
  Regexp::ParseFlags pf = re->parse_flags();
  re->Decref();
  return new Regexp(kRegexpEmptyMatch, pf);
}